

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::SourceWrapper<absl::lts_20250127::Cord>::MergeInto<false>
          (SourceWrapper<absl::lts_20250127::Cord> *this,MessageLite *msg,TcParseTableBase *tc_table
          ,ParseFlags parse_flags)

{
  byte bVar1;
  Cord *pCVar2;
  Nonnull<CordRep_*> rep;
  bool bVar3;
  undefined1 *puVar4;
  ZeroCopyInputStream this_00;
  ParseFlags in_R9D;
  string_view input;
  string_view fragment;
  CordInputStream local_e8;
  
  pCVar2 = this->cord;
  bVar1 = (pCVar2->contents_).data_.rep_.field_0.data[0];
  rep = (pCVar2->contents_).data_.rep_.field_0.as_tree.rep;
  if (rep == (Nonnull<CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) == 0) {
      puVar4 = (undefined1 *)((long)&(pCVar2->contents_).data_.rep_.field_0 + 1);
      this_00._vptr_ZeroCopyInputStream = (_func_int **)((ulong)(long)(char)bVar1 >> 1);
    }
    else {
      puVar4 = (undefined1 *)0x0;
      this_00._vptr_ZeroCopyInputStream = (_func_int **)rep->length;
    }
  }
  else {
    local_e8.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = (_func_int **)0x0;
    local_e8.it_.chunk_iterator_.current_chunk_._M_len = 0;
    bVar3 = absl::lts_20250127::Cord::GetFlatAux(rep,(Nonnull<absl::string_view_*>)&local_e8);
    puVar4 = (undefined1 *)local_e8.it_.chunk_iterator_.current_chunk_._M_len;
    this_00._vptr_ZeroCopyInputStream = local_e8.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream
    ;
    if (!bVar3) goto LAB_00220636;
  }
  if (this_00._vptr_ZeroCopyInputStream < (internal *)0x201) {
    input._M_str = (char *)msg;
    input._M_len = (size_t)puVar4;
    bVar3 = MergeFromImpl<false>
                      ((internal *)this_00._vptr_ZeroCopyInputStream,input,(MessageLite *)tc_table,
                       (TcParseTableBase *)(ulong)parse_flags,in_R9D);
    return bVar3;
  }
LAB_00220636:
  io::CordInputStream::CordInputStream(&local_e8,this->cord);
  bVar3 = MergeFromImpl<false>(&local_e8.super_ZeroCopyInputStream,msg,tc_table,parse_flags);
  return bVar3;
}

Assistant:

bool MergeInto(MessageLite* msg, const internal::TcParseTableBase* tc_table,
                 MessageLite::ParseFlags parse_flags) const {
    absl::optional<absl::string_view> flat = cord->TryFlat();
    if (flat && flat->size() <= ParseContext::kMaxCordBytesToCopy) {
      return MergeFromImpl<alias>(*flat, msg, tc_table, parse_flags);
    } else {
      io::CordInputStream input(cord);
      return MergeFromImpl<alias>(&input, msg, tc_table, parse_flags);
    }
  }